

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O0

string * sha256(string *__return_storage_ptr__,string *str)

{
  char *input;
  uint64_t length;
  allocator local_ed;
  int local_ec;
  char local_e8 [4];
  int i;
  char cdigest [64];
  char digest [32];
  undefined1 local_80 [8];
  sha256_context ctx;
  string *str_local;
  
  ctx.length = (uint64_t)str;
  sha256_start((sha256_context *)local_80);
  input = (char *)std::__cxx11::string::c_str();
  length = std::__cxx11::string::length();
  sha256_update((sha256_context *)local_80,input,length);
  sha256_finish((sha256_context *)local_80,cdigest + 0x38);
  for (local_ec = 0; local_ec < 0x20; local_ec = local_ec + 1) {
    local_e8[local_ec << 1] =
         "0123456789abcdef"[(int)((int)cdigest[(long)local_ec + 0x38] >> 4 & 0xf)];
    local_e8[local_ec * 2 + 1] =
         "0123456789abcdef"[(int)((int)cdigest[(long)local_ec + 0x38] & 0xf)];
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_e8,0x40,&local_ed);
  std::allocator<char>::~allocator((allocator<char> *)&local_ed);
  return __return_storage_ptr__;
}

Assistant:

std::string sha256(const std::string& str)
{
	sha256_context ctx;
	char digest[32];
	char cdigest[64];

	sha256_start(&ctx);
	sha256_update(&ctx, str.c_str(), str.length());
	sha256_finish(&ctx, digest);

	for (int i = 0; i < 32; ++i)
	{
		cdigest[i*2]   = "0123456789abcdef"[((digest[i] >> 4) & 0x0F)];
		cdigest[i*2+1] = "0123456789abcdef"[((digest[i]) & 0x0F)];
	}

	return std::string(cdigest, 64);
}